

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::CommandBuffer>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  TestStatus *pTVar1;
  deUint32 dVar2;
  DeviceInterface *vk;
  VkDevice device;
  VkCommandBufferLevel VVar3;
  Unique<vk::VkCommandBuffer_s_*> obj2;
  Unique<vk::VkCommandBuffer_s_*> obj1;
  Unique<vk::VkCommandBuffer_s_*> obj0;
  VkCommandBufferAllocateInfo local_108;
  Move<vk::VkCommandBuffer_s_*> local_e8;
  Move<vk::VkCommandBuffer_s_*> local_c8;
  TestStatus *local_a0;
  VkCommandBuffer_s *local_98;
  DeviceInterface *pDStack_90;
  VkDevice local_88;
  deUint64 dStack_80;
  Move<vk::VkCommandBuffer_s_*> local_78;
  Move<vk::Handle<(vk::HandleType)24>_> local_50;
  
  local_a0 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  dVar2 = Context::getUniversalQueueFamilyIndex(context);
  local_108.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_108.pNext = (void *)0x0;
  local_108.commandPool.m_internal = CONCAT44(dVar2,params.commandPool.flags.flags);
  ::vk::createCommandPool
            (&local_50,vk,device,(VkCommandPoolCreateInfo *)&local_108,(VkAllocationCallbacks *)0x0)
  ;
  local_108.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_108.pNext = (void *)0x0;
  local_108.commandPool.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  VVar3 = params.level;
  local_108.commandBufferCount = 1;
  local_108.level = VVar3;
  ::vk::allocateCommandBuffer(&local_c8,vk,device,&local_108);
  local_98 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  pDStack_90 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  local_88 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  dStack_80 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_108.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_108.pNext = (void *)0x0;
  local_108.commandPool.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_108.commandBufferCount = 1;
  local_108.level = VVar3;
  ::vk::allocateCommandBuffer(&local_e8,vk,device,&local_108);
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_108.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_108.pNext = (void *)0x0;
  local_108.commandPool.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_108.commandBufferCount = 1;
  local_108.level = VVar3;
  ::vk::allocateCommandBuffer(&local_78,vk,device,&local_108);
  local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_108.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_108.pNext = (void *)0x0;
  local_108.commandPool.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_108.commandBufferCount = 1;
  local_108.level = VVar3;
  ::vk::allocateCommandBuffer(&local_78,vk,device,&local_108);
  pTVar1 = local_a0;
  if (local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    local_108._0_8_ = local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               local_78.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    local_108._0_8_ = local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    local_108._0_8_ = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (local_98 != (VkCommandBuffer_s *)0x0) {
    local_108._0_8_ = local_98;
    (*pDStack_90->_vptr_DeviceInterface[0x48])(pDStack_90,local_88,dStack_80,1);
  }
  local_108._0_8_ = &local_108.commandPool;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Ok","");
  pTVar1->m_code = QP_TEST_RESULT_PASS;
  (pTVar1->m_description)._M_dataplus._M_p = (pointer)&(pTVar1->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar1->m_description,local_108._0_8_,
             (VkCommandBuffer_s *)((long)local_108.pNext + local_108._0_8_));
  if ((VkCommandPool *)local_108._0_8_ != &local_108.commandPool) {
    operator_delete((void *)local_108._0_8_,local_108.commandPool.m_internal + 1);
  }
  if (local_50.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&local_50.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               local_50.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}